

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

void __thiscall SoftHSM::~SoftHSM(SoftHSM *this)

{
  this->_vptr_SoftHSM = (_func_int **)&PTR__SoftHSM_0019bf68;
  if (this->handleManager != (HandleManager *)0x0) {
    (*this->handleManager->_vptr_HandleManager[1])();
  }
  this->handleManager = (HandleManager *)0x0;
  if (this->sessionManager != (SessionManager *)0x0) {
    (*this->sessionManager->_vptr_SessionManager[1])();
  }
  this->sessionManager = (SessionManager *)0x0;
  if (this->slotManager != (SlotManager *)0x0) {
    (*this->slotManager->_vptr_SlotManager[1])();
  }
  this->slotManager = (SlotManager *)0x0;
  if (this->objectStore != (ObjectStore *)0x0) {
    (*this->objectStore->_vptr_ObjectStore[1])();
  }
  this->objectStore = (ObjectStore *)0x0;
  if (this->sessionObjectStore != (SessionObjectStore *)0x0) {
    (*this->sessionObjectStore->_vptr_SessionObjectStore[1])();
  }
  this->sessionObjectStore = (SessionObjectStore *)0x0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::clear(&(this->mechanisms_table)._M_t);
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::clear
            (&this->supportedMechanisms);
  this->isInitialised = false;
  resetMutexFactoryCallbacks();
  std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear
            (&(this->supportedMechanisms).
              super__List_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&(this->mechanisms_table)._M_t);
  return;
}

Assistant:

SoftHSM::~SoftHSM()
{
	if (handleManager != NULL) delete handleManager;
	handleManager = NULL;
	if (sessionManager != NULL) delete sessionManager;
	sessionManager = NULL;
	if (slotManager != NULL) delete slotManager;
	slotManager = NULL;
	if (objectStore != NULL) delete objectStore;
	objectStore = NULL;
	if (sessionObjectStore != NULL) delete sessionObjectStore;
	sessionObjectStore = NULL;

	mechanisms_table.clear();
	supportedMechanisms.clear();

	isInitialised = false;

	resetMutexFactoryCallbacks();
}